

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::ScriptWitness::Serialize(ByteData *__return_storage_ptr__,ScriptWitness *this)

{
  pointer pBVar1;
  pointer pBVar2;
  ByteData *stack;
  pointer pBVar3;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> buffer_array;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> work_buffer;
  ByteData stack_count;
  
  buffer_array.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  buffer_array.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer_array.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ByteData::GetVariableInt
            (&stack_count,
             ((long)(this->witness_stack_).
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->witness_stack_).
                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            (&buffer_array,&stack_count);
  pBVar1 = (this->witness_stack_).
           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pBVar3 = (this->witness_stack_).
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pBVar2 = buffer_array.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_finish, pBVar3 != pBVar1; pBVar3 = pBVar3 + 1) {
    ByteData::Serialize((ByteData *)
                        &result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                        pBVar3);
    ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
    emplace_back<cfd::core::ByteData>
              (&buffer_array,
               (ByteData *)&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              );
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pBVar3 = buffer_array.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_start; pBVar3 != pBVar2; pBVar3 = pBVar3 + 1) {
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &work_buffer.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,pBVar3);
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&result,
               (const_iterator)
               result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&work_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  ByteData::ByteData(__return_storage_ptr__,&result);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&stack_count);
  ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&buffer_array);
  return __return_storage_ptr__;
}

Assistant:

ByteData ScriptWitness::Serialize() const {
  std::vector<ByteData> buffer_array;
  ByteData stack_count = ByteData::GetVariableInt(witness_stack_.size());
  buffer_array.push_back(stack_count);
  for (const ByteData &stack : witness_stack_) {
    buffer_array.push_back(stack.Serialize());
  }

  std::vector<uint8_t> result;
  for (const ByteData &buffer : buffer_array) {
    std::vector<uint8_t> work_buffer = buffer.GetBytes();
    result.insert(result.end(), work_buffer.begin(), work_buffer.end());
  }
  return ByteData(result);
}